

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

DescriptorFlags __thiscall
Js::DictionaryTypeHandlerBase<int>::GetSetter_Internal<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint32 index;
  DescriptorFlags DVar5;
  undefined4 *puVar6;
  Var pvVar7;
  int local_54;
  DictionaryPropertyDescriptor<int> *pDStack_50;
  int i;
  DictionaryPropertyDescriptor<int> *descriptor;
  PropertyRecord *propertyRecord;
  ScriptContext *local_38;
  
  propertyRecord = (PropertyRecord *)info;
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    local_38 = requestContext;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x284,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    requestContext = local_38;
  }
  descriptor = (DictionaryPropertyDescriptor<int> *)
               ScriptContext::GetPropertyName
                         ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)
                          ->super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,(PropertyRecord **)&descriptor,
                     &stack0xffffffffffffffb0,&local_54);
  if (bVar3) {
    DVar5 = None;
    if ((pDStack_50->Attributes & 8) == 0) {
      iVar4 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>(pDStack_50);
      if (iVar4 == -1) {
        iVar4 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDStack_50);
        DVar5 = None;
        if (iVar4 != -1) {
          iVar4 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDStack_50);
          pvVar7 = DynamicObject::GetSlot(instance,iVar4);
          *setterValue = pvVar7;
          DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDStack_50);
          DVar5 = Accessor;
          if (propertyRecord != (PropertyRecord *)0x0) {
            (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject = (_func_int **)instance;
            propertyRecord->pid = 0xffff;
          }
        }
      }
      else {
        bVar1 = pDStack_50->Attributes;
        if ((bVar1 & 0x10) == 0) {
          DVar5 = WritableData;
          if ((bVar1 & 4) == 0) {
            DVar5 = (uint)(bVar1 >> 7) * 8 + Data;
          }
        }
        else {
          DVar5 = (uint)(bVar1 >> 7) * 4 + WritableData;
        }
      }
    }
  }
  else {
    bVar3 = DynamicObject::HasObjectArray(instance);
    DVar5 = None;
    if ((bVar3) && (descriptor[1].flags == PreventFalseReference)) {
      index = PropertyRecord::GetNumericValue((PropertyRecord *)descriptor);
      DVar5 = GetItemSetter(this,instance,index,setterValue,requestContext);
    }
  }
  return DVar5;
}

Assistant:

DescriptorFlags DictionaryTypeHandlerBase<T>::GetSetter_Internal(DynamicObject* instance, PropertyId propertyId, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DictionaryPropertyDescriptor<T>* descriptor;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return GetSetterFromDescriptor<allowLetConstGlobal>(instance, descriptor, setterValue, info);
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return DictionaryTypeHandlerBase<T>::GetItemSetter(instance, propertyRecord->GetNumericValue(), setterValue, requestContext);
        }

        return None;
    }